

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O3

Expression *
slang::ast::IntegerLiteral::fromSyntax(Compilation *compilation,LiteralExpressionSyntax *syntax)

{
  Type *args_1;
  IntegerLiteral *pIVar1;
  SVInt val;
  bool local_39;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  undefined1 local_2c;
  byte local_2b;
  Token local_28;
  undefined1 auVar2 [14];
  
  if ((syntax->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
      IntegerLiteralExpression) {
    parsing::Token::intValue(&local_28);
    local_28._0_14_ = auVar2;
    SVInt::resize((SVInt *)&local_38,(bitwidth_t)&local_28);
    if (((0x40 < (uint)local_28.info) ||
        (((undefined1  [14])local_28._0_14_ & (undefined1  [14])0x10000000000) !=
         (undefined1  [14])0x0)) && ((void *)local_28._0_8_ != (void *)0x0)) {
      operator_delete__((void *)local_28._0_8_);
    }
    local_2c = 1;
    args_1 = compilation->intType;
    local_39 = true;
    local_28 = (Token)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pIVar1 = BumpAllocator::
             emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange>
                       (&compilation->super_BumpAllocator,compilation,args_1,(SVInt *)&local_38,
                        &local_39,(SourceRange *)&local_28);
    if (((0x40 < local_30) || ((local_2b & 1) != 0)) && ((void *)local_38.val != (void *)0x0)) {
      operator_delete__(local_38.pVal);
    }
    return &pIVar1->super_Expression;
  }
  assert::assertFailed
            ("syntax.kind == SyntaxKind::IntegerLiteralExpression",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
             ,0x25,
             "static Expression &slang::ast::IntegerLiteral::fromSyntax(Compilation &, const LiteralExpressionSyntax &)"
            );
}

Assistant:

Expression& IntegerLiteral::fromSyntax(Compilation& compilation,
                                       const LiteralExpressionSyntax& syntax) {
    ASSERT(syntax.kind == SyntaxKind::IntegerLiteralExpression);

    SVInt val = syntax.literal.intValue().resize(32);
    val.setSigned(true);

    return *compilation.emplace<IntegerLiteral>(compilation, compilation.getIntType(),
                                                std::move(val), true, syntax.sourceRange());
}